

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_4_0_compatibility.cpp
# Opt level: O3

bool QOpenGLFunctions_4_0_Compatibility::isContextCompatible(QOpenGLContext *context)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QSurfaceFormat f;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QOpenGLContext::format();
  iVar1 = QSurfaceFormat::majorVersion();
  iVar2 = QSurfaceFormat::minorVersion();
  if ((iVar1 < 4) || ((iVar1 == 4 && (iVar2 < 0)))) {
    bVar3 = false;
  }
  else {
    iVar1 = QSurfaceFormat::profile();
    bVar3 = iVar1 != 1;
  }
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLFunctions_4_0_Compatibility::isContextCompatible(QOpenGLContext *context)
{
    Q_ASSERT(context);
    QSurfaceFormat f = context->format();
    const auto v = std::pair(f.majorVersion(), f.minorVersion());
    if (v < std::pair(4, 0))
        return false;

    if (f.profile() == QSurfaceFormat::CoreProfile)
        return false;

    return true;
}